

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

ScanResult * __thiscall
wallet::CWallet::ScanForWalletTransactions
          (ScanResult *__return_storage_ptr__,CWallet *this,uint256 *start_block,int start_height,
          optional<int> max_height,WalletRescanReserver *reserver,bool fUpdate,bool save_progress)

{
  signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::signals2::mutex>
  *this_00;
  RecursiveMutex *mutexIn;
  long lVar1;
  map<uint256,_int,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_int>_>_> *this_01;
  _Rb_tree_node_base *p_Var2;
  long lVar3;
  double dVar4;
  double dVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters;
  bool bVar6;
  base_blob<256U> *pbVar7;
  unique_ptr<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
  uVar8;
  unique_ptr<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
  uVar9;
  pointer puVar10;
  bool bVar11;
  int iVar12;
  int32_t iVar13;
  uint uVar14;
  uint uVar15;
  time_point tVar16;
  Chain *pCVar17;
  __uniq_ptr_data<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>,_true,_true>
  this_02;
  CWallet *desc_spkm;
  _Optional_payload_base<int> *p_Var18;
  double dVar19;
  time_point tVar20;
  ScriptPubKeyMan *pSVar21;
  DescriptorScriptPubKeyMan *this_03;
  mapped_type_conflict3 *pmVar22;
  _Rb_tree_node_base *p_Var23;
  WalletDatabase *pWVar24;
  char *pcVar25;
  uint256 *puVar26;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  long lVar27;
  Level level;
  CWallet *pCVar28;
  size_t posInBlock;
  ulong uVar29;
  pointer __p;
  long in_FS_OFFSET;
  bool bVar30;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  ScanResult *args_00;
  undefined4 in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  base_blob<256u> *in_stack_fffffffffffffda8;
  double parameters_1;
  CWallet *pCVar31;
  double local_200;
  duration local_1f8;
  WalletBatch local_1d8;
  bool next_block;
  bool block_still_active;
  int block_height;
  unique_ptr<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
  fast_rescan_filter;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock42;
  undefined8 local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_198;
  undefined8 uStack_178;
  undefined8 local_170;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_168;
  CBlockLocator loc;
  undefined1 local_130;
  undefined1 uStack_12f;
  undefined1 uStack_12e;
  undefined1 uStack_12d;
  undefined1 uStack_12c;
  undefined1 uStack_12b;
  undefined1 uStack_12a;
  undefined1 uStack_129;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock43;
  uint256 next_block_hash;
  uint256 end_hash;
  uint256 tip_hash;
  string local_78;
  uint256 block_hash;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  local_1f8.__r = (rep)WalletRescanReserver::now(reserver);
  tVar16 = WalletRescanReserver::now(reserver);
  if ((reserver->m_could_reserve != true) ||
     (((reserver->m_wallet->fScanningWallet)._M_base._M_i & 1U) == 0)) {
    __assert_fail("reserver.isReserved()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                  ,0x75a,
                  "CWallet::ScanResult wallet::CWallet::ScanForWalletTransactions(const uint256 &, int, std::optional<int>, const WalletRescanReserver &, bool, const bool)"
                 );
  }
  block_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(start_block->super_base_blob<256U>).m_data._M_elems;
  block_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((start_block->super_base_blob<256U>).m_data._M_elems + 8);
  block_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((start_block->super_base_blob<256U>).m_data._M_elems + 0x10);
  block_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((start_block->super_base_blob<256U>).m_data._M_elems + 0x18);
  (__return_storage_ptr__->last_scanned_height).super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_engaged = false;
  puVar26 = &__return_storage_ptr__->last_failed_block;
  (puVar26->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar26->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar26->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar26->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar26->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar26->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar26->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar26->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar7 = &(__return_storage_ptr__->last_failed_block).super_base_blob<256U>;
  (pbVar7->m_data)._M_elems[8] = '\0';
  (pbVar7->m_data)._M_elems[9] = '\0';
  (pbVar7->m_data)._M_elems[10] = '\0';
  (pbVar7->m_data)._M_elems[0xb] = '\0';
  (pbVar7->m_data)._M_elems[0xc] = '\0';
  (pbVar7->m_data)._M_elems[0xd] = '\0';
  (pbVar7->m_data)._M_elems[0xe] = '\0';
  (pbVar7->m_data)._M_elems[0xf] = '\0';
  pbVar7 = &(__return_storage_ptr__->last_failed_block).super_base_blob<256U>;
  (pbVar7->m_data)._M_elems[0x10] = '\0';
  (pbVar7->m_data)._M_elems[0x11] = '\0';
  (pbVar7->m_data)._M_elems[0x12] = '\0';
  (pbVar7->m_data)._M_elems[0x13] = '\0';
  (pbVar7->m_data)._M_elems[0x14] = '\0';
  (pbVar7->m_data)._M_elems[0x15] = '\0';
  (pbVar7->m_data)._M_elems[0x16] = '\0';
  (pbVar7->m_data)._M_elems[0x17] = '\0';
  pbVar7 = &(__return_storage_ptr__->last_failed_block).super_base_blob<256U>;
  (pbVar7->m_data)._M_elems[0x18] = '\0';
  (pbVar7->m_data)._M_elems[0x19] = '\0';
  (pbVar7->m_data)._M_elems[0x1a] = '\0';
  (pbVar7->m_data)._M_elems[0x1b] = '\0';
  (pbVar7->m_data)._M_elems[0x1c] = '\0';
  (pbVar7->m_data)._M_elems[0x1d] = '\0';
  (pbVar7->m_data)._M_elems[0x1e] = '\0';
  (pbVar7->m_data)._M_elems[0x1f] = '\0';
  pbVar7 = &(__return_storage_ptr__->last_scanned_block).super_base_blob<256U>;
  (pbVar7->m_data)._M_elems[0x1c] = '\0';
  (pbVar7->m_data)._M_elems[0x1d] = '\0';
  (pbVar7->m_data)._M_elems[0x1e] = '\0';
  (pbVar7->m_data)._M_elems[0x1f] = '\0';
  fast_rescan_filter._M_t.
  super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
  ._M_t.
  super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
  .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>.
  _M_head_impl = (__uniq_ptr_data<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>,_true,_true>
                  )(__uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                    )0x0;
  __return_storage_ptr__->status = SUCCESS;
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[0] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[1] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[2] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[3] = '\0';
  pbVar7 = &(__return_storage_ptr__->last_scanned_block).super_base_blob<256U>;
  (pbVar7->m_data)._M_elems[4] = '\0';
  (pbVar7->m_data)._M_elems[5] = '\0';
  (pbVar7->m_data)._M_elems[6] = '\0';
  (pbVar7->m_data)._M_elems[7] = '\0';
  (pbVar7->m_data)._M_elems[8] = '\0';
  (pbVar7->m_data)._M_elems[9] = '\0';
  (pbVar7->m_data)._M_elems[10] = '\0';
  (pbVar7->m_data)._M_elems[0xb] = '\0';
  pbVar7 = &(__return_storage_ptr__->last_scanned_block).super_base_blob<256U>;
  (pbVar7->m_data)._M_elems[0xc] = '\0';
  (pbVar7->m_data)._M_elems[0xd] = '\0';
  (pbVar7->m_data)._M_elems[0xe] = '\0';
  (pbVar7->m_data)._M_elems[0xf] = '\0';
  (pbVar7->m_data)._M_elems[0x10] = '\0';
  (pbVar7->m_data)._M_elems[0x11] = '\0';
  (pbVar7->m_data)._M_elems[0x12] = '\0';
  (pbVar7->m_data)._M_elems[0x13] = '\0';
  pbVar7 = &(__return_storage_ptr__->last_scanned_block).super_base_blob<256U>;
  (pbVar7->m_data)._M_elems[0x14] = '\0';
  (pbVar7->m_data)._M_elems[0x15] = '\0';
  (pbVar7->m_data)._M_elems[0x16] = '\0';
  (pbVar7->m_data)._M_elems[0x17] = '\0';
  (pbVar7->m_data)._M_elems[0x18] = '\0';
  (pbVar7->m_data)._M_elems[0x19] = '\0';
  (pbVar7->m_data)._M_elems[0x1a] = '\0';
  (pbVar7->m_data)._M_elems[0x1b] = '\0';
  pCVar31 = this;
  if (((this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i >> 0x22 & 1) != 0) {
    pCVar17 = chain(this);
    iVar12 = (*pCVar17->_vptr_Chain[8])(pCVar17,0);
    if ((char)iVar12 != '\0') {
      this_02.
      super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
      ._M_t.
      super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
      .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>.
      _M_head_impl = (__uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                      )operator_new(0x80);
      *(CWallet **)
       this_02.
       super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
       ._M_t.
       super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
       .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>.
       _M_head_impl = this;
      (((_Rb_tree_header *)
       ((long)this_02.
              super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              ._M_t.
              super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
              ._M_head_impl + 0x10))->_M_header)._M_color = _S_red;
      *(_Base_ptr *)
       ((long)this_02.
              super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              ._M_t.
              super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
              ._M_head_impl + 0x18) = (_Base_ptr)0x0;
      *(_Base_ptr *)
       ((long)this_02.
              super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              ._M_t.
              super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
              ._M_head_impl + 0x20) =
           (_Base_ptr)
           ((long)this_02.
                  super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                  .
                  super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                  ._M_head_impl + 0x10);
      *(_Base_ptr *)
       ((long)this_02.
              super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              ._M_t.
              super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
              ._M_head_impl + 0x28) =
           (_Base_ptr)
           ((long)this_02.
                  super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                  .
                  super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                  ._M_head_impl + 0x10);
      *(size_t *)
       ((long)this_02.
              super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              ._M_t.
              super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
              ._M_head_impl + 0x30) = 0;
      std::
      _Hashtable<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::__detail::_Identity,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ByteVectorHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::_Hashtable((_Hashtable<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::__detail::_Identity,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ByteVectorHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)((long)this_02.
                             super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                             .
                             super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                             ._M_head_impl + 0x38));
      if ((*(ulong *)(*(long *)this_02.
                               super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                               .
                               super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                               ._M_head_impl + 0xb0) & 0x400000000) == 0) {
        __assert_fail("!m_wallet.IsLegacy()",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                      ,0x13d,
                      "wallet::(anonymous namespace)::FastWalletRescanFilter::FastWalletRescanFilter(const CWallet &)"
                     );
      }
      pCVar28 = *(CWallet **)
                 this_02.
                 super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                 .
                 super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                 ._M_head_impl;
      GetAllScriptPubKeyMans
                ((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                  *)&criticalblock42,pCVar28);
      for (; (bool *)local_1a0 != &criticalblock42.super_unique_lock._M_owns;
          local_1a0 = std::_Rb_tree_increment((_Rb_tree_node_base *)local_1a0)) {
        if ((*(long *)(local_1a0 + 0x20) == 0) ||
           (desc_spkm = (CWallet *)
                        __dynamic_cast(*(long *)(local_1a0 + 0x20),&ScriptPubKeyMan::typeinfo,
                                       &DescriptorScriptPubKeyMan::typeinfo,0),
           desc_spkm == (CWallet *)0x0)) {
          __assert_fail("desc_spkm != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                        ,0x142,
                        "wallet::(anonymous namespace)::FastWalletRescanFilter::FastWalletRescanFilter(const CWallet &)"
                       );
        }
        pCVar28 = desc_spkm;
        anon_unknown_48::FastWalletRescanFilter::AddScriptPubKeys
                  ((FastWalletRescanFilter *)
                   this_02.
                   super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                   .
                   super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                   ._M_head_impl,(DescriptorScriptPubKeyMan *)desc_spkm,0);
        iVar12 = (*(desc_spkm->super_WalletStorage)._vptr_WalletStorage[0xc])(desc_spkm);
        if ((char)iVar12 != '\0') {
          (*(desc_spkm->super_WalletStorage)._vptr_WalletStorage[0x1a])((CWallet *)&loc,desc_spkm);
          iVar13 = DescriptorScriptPubKeyMan::GetEndRange((DescriptorScriptPubKeyMan *)desc_spkm);
          end_hash.super_base_blob<256U>.m_data._M_elems[0] = (char)iVar13;
          end_hash.super_base_blob<256U>.m_data._M_elems[1] = (char)((uint)iVar13 >> 8);
          end_hash.super_base_blob<256U>.m_data._M_elems[2] = (char)((uint)iVar13 >> 0x10);
          end_hash.super_base_blob<256U>.m_data._M_elems[3] = (char)((uint)iVar13 >> 0x18);
          pCVar28 = (CWallet *)&loc;
          std::
          _Rb_tree<uint256,std::pair<uint256_const,int>,std::_Select1st<std::pair<uint256_const,int>>,std::less<uint256>,std::allocator<std::pair<uint256_const,int>>>
          ::_M_emplace_unique<uint256,int>
                    ((_Rb_tree<uint256,std::pair<uint256_const,int>,std::_Select1st<std::pair<uint256_const,int>>,std::less<uint256>,std::allocator<std::pair<uint256_const,int>>>
                      *)((long)this_02.
                               super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                               .
                               super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                               ._M_head_impl + 8),(uint256 *)&loc,(int *)&end_hash);
        }
      }
      std::
      _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
      ::~_Rb_tree((_Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                   *)&criticalblock42);
      uVar8 = fast_rescan_filter;
      tip_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      tip_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      tip_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      tip_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      tip_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      tip_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      tip_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      tip_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      bVar30 = (__uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                )fast_rescan_filter._M_t.
                 super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                 .
                 super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                 ._M_head_impl !=
               (__uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                )0x0;
      this = pCVar31;
      fast_rescan_filter._M_t.
      super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
      ._M_t.
      super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
      .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>.
      _M_head_impl = (__uniq_ptr_data<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>,_true,_true>
                      )(__uniq_ptr_data<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>,_true,_true>
                        )this_02.
                         super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                         .
                         super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                         ._M_head_impl;
      if (bVar30) {
        std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>::operator()
                  ((default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter> *)
                   uVar8._M_t.
                   super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                   .
                   super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                   ._M_head_impl,(FastWalletRescanFilter *)pCVar28);
        this = pCVar31;
      }
      std::
      unique_ptr<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
      ::~unique_ptr((unique_ptr<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                     *)&tip_hash);
      in_stack_fffffffffffffda4 = start_height;
      in_stack_fffffffffffffda8 = (base_blob<256u> *)start_block;
      pCVar31 = this;
    }
  }
  base_blob<256u>::ToString_abi_cxx11_(&local_78,(base_blob<256u> *)start_block);
  pcVar25 = "fast variant using block filters";
  if ((__uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
       )fast_rescan_filter._M_t.
        super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
        ._M_t.
        super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
        .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>.
        _M_head_impl ==
      (__uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
       )0x0) {
    pcVar25 = "slow variant inspecting all blocks";
  }
  parameters._M_string_length._0_4_ = in_stack_fffffffffffffda0;
  parameters._M_dataplus._M_p = (pointer)__return_storage_ptr__;
  parameters._M_string_length._4_4_ = in_stack_fffffffffffffda4;
  parameters.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffda8;
  parameters.field_2._8_8_ = pCVar31;
  WalletLogPrintf<std::__cxx11::string,char_const*>
            (this,"Rescan started from block %s... (%s)\n",parameters,(char *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  LOCK();
  (this->fAbortRescan)._M_base._M_i = false;
  UNLOCK();
  _((bilingual_str *)&criticalblock42,(ConstevalStringLiteral)0xe1baf4);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tip_hash,
                 "%s ",&bStack_198);
  GetDisplayName_abi_cxx11_((string *)&end_hash,this);
  tinyformat::format<std::__cxx11::string>
            ((string *)&loc,(tinyformat *)&tip_hash,(string *)&end_hash,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar25);
  this_00 = &this->ShowProgress;
  boost::signals2::
  signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::signals2::mutex>
  ::operator()(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&loc,0);
  std::__cxx11::string::~string((string *)&loc);
  std::__cxx11::string::~string((string *)&end_hash);
  std::__cxx11::string::~string((string *)&tip_hash);
  bilingual_str::~bilingual_str((bilingual_str *)&criticalblock42);
  mutexIn = &this->cs_wallet;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock42,mutexIn,"cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
             ,0x767,false);
  GetLastBlockHash(&tip_hash,this);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&criticalblock42);
  end_hash.super_base_blob<256U>.m_data._M_elems[0x10] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x10];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x11] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x11];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x12] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x12];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x13] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x13];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x14] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x14];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x15] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x15];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x16] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x16];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x17] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x17];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x18] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x18];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x19] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x19];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x1a];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x1b];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x1c];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x1d];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x1e];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x1f];
  end_hash.super_base_blob<256U>.m_data._M_elems[0] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0];
  end_hash.super_base_blob<256U>.m_data._M_elems[1] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[1];
  end_hash.super_base_blob<256U>.m_data._M_elems[2] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[2];
  end_hash.super_base_blob<256U>.m_data._M_elems[3] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[3];
  end_hash.super_base_blob<256U>.m_data._M_elems[4] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[4];
  end_hash.super_base_blob<256U>.m_data._M_elems[5] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[5];
  end_hash.super_base_blob<256U>.m_data._M_elems[6] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[6];
  end_hash.super_base_blob<256U>.m_data._M_elems[7] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[7];
  end_hash.super_base_blob<256U>.m_data._M_elems[8] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[8];
  end_hash.super_base_blob<256U>.m_data._M_elems[9] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[9];
  end_hash.super_base_blob<256U>.m_data._M_elems[10] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[10];
  end_hash.super_base_blob<256U>.m_data._M_elems[0xb] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0xb];
  end_hash.super_base_blob<256U>.m_data._M_elems[0xc] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0xc];
  end_hash.super_base_blob<256U>.m_data._M_elems[0xd] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0xd];
  end_hash.super_base_blob<256U>.m_data._M_elems[0xe] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0xe];
  end_hash.super_base_blob<256U>.m_data._M_elems[0xf] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0xf];
  if (((ulong)max_height.super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int> >> 0x20 & 1) != 0) {
    pCVar17 = chain(this);
    bStack_198.field_2._8_8_ = (SyncTxState *)0x0;
    uStack_178._0_1_ = '\0';
    uStack_178._1_1_ = '\0';
    uStack_178._2_1_ = '\0';
    uStack_178._3_1_ = '\0';
    uStack_178._4_4_ = 0;
    bStack_198._M_string_length = 0;
    bStack_198.field_2._M_allocated_capacity = 0;
    local_170._0_4_ = 0;
    local_170._4_4_ = 0;
    bStack_198._M_dataplus._M_p = (pointer)0x0;
    criticalblock42.super_unique_lock._M_owns = false;
    criticalblock42.super_unique_lock._9_7_ = 0;
    criticalblock42.super_unique_lock._M_device = (mutex_type *)&end_hash;
    (*pCVar17->_vptr_Chain[0xc])
              (pCVar17,&tip_hash,
               max_height.super__Optional_base<int,_true,_true>._M_payload.
               super__Optional_payload_base<int>);
  }
  pCVar17 = chain(this);
  (*pCVar17->_vptr_Chain[0x10])(pCVar17,&block_hash);
  dVar4 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  pCVar17 = chain(this);
  (*pCVar17->_vptr_Chain[0x10])(pCVar17);
  local_200 = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
  puVar26 = &__return_storage_ptr__->last_scanned_block;
  uVar14 = (uint)fUpdate;
  pcVar25 = (char *)puVar26;
  args_00 = __return_storage_ptr__;
  parameters_1 = dVar4;
  block_height = start_height;
  puVar10 = (pointer)tip_hash.super_base_blob<256U>.m_data._M_elems._24_8_;
  while( true ) {
    tip_hash.super_base_blob<256U>.m_data._M_elems._24_8_ = puVar10;
    if (((this->fAbortRescan)._M_base._M_i & 1U) != 0) break;
    p_Var18 = (_Optional_payload_base<int> *)chain(this);
    pcVar25 = *(char **)p_Var18;
    iVar12 = (**(_func_int **)((long)pcVar25 + 0x120))(p_Var18);
    if ((char)iVar12 != '\0') break;
    dVar5 = local_200 - dVar4;
    dVar19 = (parameters_1 - dVar4) / dVar5;
    if (dVar5 <= 0.0) {
      dVar19 = 0.0;
    }
    LOCK();
    (this->m_scanning_progress).super___atomic_float<double>._M_fp = dVar19;
    UNLOCK();
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x64;
    if ((0.0 < dVar5) && (block_height % 100 == 0)) {
      _((bilingual_str *)&criticalblock42,(ConstevalStringLiteral)0xe1baf4);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &next_block_hash,"%s ",&bStack_198);
      GetDisplayName_abi_cxx11_((string *)&criticalblock43,this);
      tinyformat::format<std::__cxx11::string>
                ((string *)&loc,(tinyformat *)&next_block_hash,(string *)&criticalblock43,args);
      iVar12 = (int)((this->m_scanning_progress).super___atomic_float<double>._M_fp * 100.0);
      if (0x62 < iVar12) {
        iVar12 = 99;
      }
      if (iVar12 < 2) {
        iVar12 = 1;
      }
      boost::signals2::
      signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::signals2::mutex>
      ::operator()(this_00,(string *)&loc,iVar12);
      std::__cxx11::string::~string((string *)&loc);
      std::__cxx11::string::~string((string *)&criticalblock43);
      std::__cxx11::string::~string((string *)&next_block_hash);
      bilingual_str::~bilingual_str((bilingual_str *)&criticalblock42);
    }
    tVar20 = WalletRescanReserver::now(reserver);
    lVar1 = local_1f8.__r + 60000000000;
    if (lVar1 <= (long)tVar20.__d.__r) {
      local_1f8.__r = (rep)WalletRescanReserver::now(reserver);
      WalletLogPrintf<int,double>
                (this,"Still rescanning. At block %d. Progress=%f\n",block_height,parameters_1);
    }
    uVar8._M_t.
    super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
    ._M_t.
    super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
    .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>.
    _M_head_impl = fast_rescan_filter._M_t.
                   super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                   .
                   super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                   ._M_head_impl;
    bVar6 = true;
    bVar30 = bVar6;
    if ((__uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
         )fast_rescan_filter._M_t.
          super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
          ._M_t.
          super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
          .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>.
          _M_head_impl !=
        (__uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
         )0x0) {
      this_01 = (map<uint256,_int,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_int>_>_>
                 *)((long)fast_rescan_filter._M_t.
                          super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                          .
                          super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                          ._M_head_impl + 8);
      p_Var2 = (_Rb_tree_node_base *)
               ((long)fast_rescan_filter._M_t.
                      super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                      .
                      super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                      ._M_head_impl + 0x10);
      this = pCVar31;
      for (p_Var23 = *(_Rb_tree_node_base **)
                      ((long)fast_rescan_filter._M_t.
                             super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                             .
                             super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                             ._M_head_impl + 0x20);
          uVar9._M_t.
          super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
          ._M_t.
          super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
          .super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>.
          _M_head_impl = fast_rescan_filter._M_t.
                         super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                         .
                         super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                         ._M_head_impl, p_Var23 != p_Var2;
          p_Var23 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var23)) {
        pSVar21 = GetScriptPubKeyMan(*(CWallet **)
                                      uVar8._M_t.
                                      super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                                      .
                                      super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                                      ._M_head_impl,(uint256 *)(p_Var23 + 1));
        if ((pSVar21 == (ScriptPubKeyMan *)0x0) ||
           (this_03 = (DescriptorScriptPubKeyMan *)
                      __dynamic_cast(pSVar21,&ScriptPubKeyMan::typeinfo,
                                     &DescriptorScriptPubKeyMan::typeinfo,0),
           this_03 == (DescriptorScriptPubKeyMan *)0x0)) {
          __assert_fail("desc_spkm != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                        ,0x150,
                        "void wallet::(anonymous namespace)::FastWalletRescanFilter::UpdateIfNeeded()"
                       );
        }
        iVar13 = DescriptorScriptPubKeyMan::GetEndRange(this_03);
        if ((int)p_Var23[2]._M_color < iVar13) {
          anon_unknown_48::FastWalletRescanFilter::AddScriptPubKeys
                    ((FastWalletRescanFilter *)
                     uVar8._M_t.
                     super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                     .
                     super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                     ._M_head_impl,this_03,p_Var23[2]._M_color);
          (*(this_03->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1a])
                    ((CBlock *)&criticalblock42,this_03);
          pmVar22 = std::
                    map<uint256,_int,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_int>_>_>
                    ::at(this_01,(key_type *)&criticalblock42);
          *pmVar22 = iVar13;
        }
      }
      pCVar17 = chain(*(CWallet **)
                       fast_rescan_filter._M_t.
                       super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                       .
                       super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                       ._M_head_impl);
      level = Trace;
      uVar15 = (*pCVar17->_vptr_Chain[9])
                         (pCVar17,0,&block_hash,
                          (long)uVar9._M_t.
                                super___uniq_ptr_impl<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                                .
                                super__Head_base<0UL,_wallet::(anonymous_namespace)::FastWalletRescanFilter_*,_false>
                                ._M_head_impl + 0x38);
      pCVar31 = this;
      if ((uVar15 >> 8 & 1) == 0) {
        bVar11 = ::LogAcceptCategory((LogFlags)pCVar17,level);
        bVar30 = true;
        if (bVar11) {
          base_blob<256u>::ToString_abi_cxx11_
                    ((string *)&criticalblock42,(base_blob<256u> *)&block_hash);
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
          ;
          source_file._M_len = 0x5a;
          logging_function._M_str = "ScanForWalletTransactions";
          logging_function._M_len = 0x19;
          LogPrintf_<int,std::__cxx11::string>
                    (logging_function,source_file,0x78b,
                     IPC|I2P|VALIDATION|MEMPOOLREJ|PROXY|RAND|CMPCTBLOCK|REINDEX|ADDRMAN|ESTIMATEFEE
                     |WALLETDB|ZMQ|BENCH|HTTP|MEMPOOL|NET,(Level)&block_height,
                     (char *)&criticalblock42,(int *)args_00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(uVar14,in_stack_fffffffffffffda0));
LAB_009a581d:
          std::__cxx11::string::~string((string *)&criticalblock42);
          bVar30 = bVar6;
        }
      }
      else if ((uVar15 & 1) == 0) {
        *(undefined8 *)
         ((__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems + 0x10)
             = block_hash.super_base_blob<256U>.m_data._M_elems._16_8_;
        *(undefined8 *)
         ((__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems + 0x18)
             = block_hash.super_base_blob<256U>.m_data._M_elems._24_8_;
        *(undefined8 *)(puVar26->super_base_blob<256U>).m_data._M_elems =
             block_hash.super_base_blob<256U>.m_data._M_elems._0_8_;
        *(undefined8 *)
         ((__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems + 8) =
             block_hash.super_base_blob<256U>.m_data._M_elems._8_8_;
        (args_00->last_scanned_height).super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int> =
             (_Optional_payload_base<int>)((ulong)(uint)block_height | 0x100000000);
        bVar30 = false;
      }
      else {
        bVar11 = ::LogAcceptCategory((LogFlags)pCVar17,level);
        if (bVar11) {
          base_blob<256u>::ToString_abi_cxx11_
                    ((string *)&criticalblock42,(base_blob<256u> *)&block_hash);
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
          ;
          source_file_00._M_len = 0x5a;
          logging_function_00._M_str = "ScanForWalletTransactions";
          logging_function_00._M_len = 0x19;
          LogPrintf_<int,std::__cxx11::string>
                    (logging_function_00,source_file_00,0x784,
                     IPC|I2P|VALIDATION|MEMPOOLREJ|PROXY|RAND|CMPCTBLOCK|REINDEX|ADDRMAN|ESTIMATEFEE
                     |WALLETDB|HTTP,(Level)&block_height,(char *)&criticalblock42,(int *)args_00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(uVar14,in_stack_fffffffffffffda0));
          goto LAB_009a581d;
        }
      }
    }
    block_still_active = false;
    next_block = false;
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    next_block_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    p_Var18 = (_Optional_payload_base<int> *)chain(this);
    bStack_198._M_dataplus._M_p = (pointer)0x0;
    uStack_178._0_1_ = '\0';
    uStack_178._1_1_ = '\0';
    uStack_178._2_1_ = '\0';
    uStack_178._3_1_ = '\0';
    uStack_178._4_4_ = 0;
    local_170._0_4_ = 0;
    local_170._4_4_ = 0;
    bStack_198.field_2._M_allocated_capacity = 0;
    criticalblock42.super_unique_lock._M_device = (mutex_type *)0x0;
    criticalblock42.super_unique_lock._M_owns = false;
    criticalblock42.super_unique_lock._9_7_ = 0;
    bStack_198._M_string_length = (size_type)&block_still_active;
    _local_130 = (pointer)0x0;
    loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_start = &next_block_hash;
    pcVar25 = *(char **)p_Var18;
    bStack_198.field_2._8_8_ = (SyncTxState *)&loc;
    (**(_func_int **)((long)pcVar25 + 0x50))(p_Var18,&block_hash,(CBlock *)&criticalblock42);
    if (bVar30) {
      CBlock::CBlock((CBlock *)&criticalblock42);
      p_Var18 = (_Optional_payload_base<int> *)chain(this);
      loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      _local_130 = (pointer)0x0;
      loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pcVar25 = *(char **)p_Var18;
      (**(_func_int **)((long)pcVar25 + 0x50))(p_Var18,&block_hash,(SyncTxState *)&loc);
      if ((uint32_t)local_170 == 0) {
        *(undefined8 *)
         ((__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems + 0x10)
             = block_hash.super_base_blob<256U>.m_data._M_elems._16_8_;
        *(undefined8 *)
         ((__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems + 0x18)
             = block_hash.super_base_blob<256U>.m_data._M_elems._24_8_;
        *(undefined8 *)
         (__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems =
             block_hash.super_base_blob<256U>.m_data._M_elems._0_8_;
        *(undefined8 *)
         ((__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems + 8) =
             block_hash.super_base_blob<256U>.m_data._M_elems._8_8_;
        args_00->status = FAILURE;
LAB_009a5bf6:
        iVar12 = 0;
        this = pCVar31;
      }
      else {
        pcVar25 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
        ;
        UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                  (&criticalblock43,mutexIn,"cs_wallet",
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                   ,0x79c,false);
        bVar30 = block_still_active;
        if (block_still_active == true) {
          lVar27 = 0;
          for (uVar29 = 0;
              uVar29 < (ulong)((long)local_168.
                                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_168.
                                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4);
              uVar29 = uVar29 + 1) {
            loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)block_hash.super_base_blob<256U>.m_data._M_elems._0_8_;
            loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)block_hash.super_base_blob<256U>.m_data._M_elems._8_8_;
            loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)block_hash.super_base_blob<256U>.m_data._M_elems._16_8_;
            local_130 = block_hash.super_base_blob<256U>.m_data._M_elems[0x18];
            uStack_12f = block_hash.super_base_blob<256U>.m_data._M_elems[0x19];
            uStack_12e = block_hash.super_base_blob<256U>.m_data._M_elems[0x1a];
            uStack_12d = block_hash.super_base_blob<256U>.m_data._M_elems[0x1b];
            uStack_12c = block_hash.super_base_blob<256U>.m_data._M_elems[0x1c];
            uStack_12b = block_hash.super_base_blob<256U>.m_data._M_elems[0x1d];
            uStack_12a = block_hash.super_base_blob<256U>.m_data._M_elems[0x1e];
            uStack_129 = block_hash.super_base_blob<256U>.m_data._M_elems[0x1f];
            SyncTransaction(pCVar31,(CTransactionRef *)
                                    ((long)&((local_168.
                                              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_ptr + lVar27),(SyncTxState *)&loc,SUB41(uVar14,0),
                            true);
            lVar27 = lVar27 + 0x10;
          }
          *(undefined4 *)
           ((__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems +
           0x10) = block_hash.super_base_blob<256U>.m_data._M_elems._16_4_;
          *(undefined4 *)
           ((__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems +
           0x14) = block_hash.super_base_blob<256U>.m_data._M_elems._20_4_;
          *(undefined4 *)
           ((__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems +
           0x18) = block_hash.super_base_blob<256U>.m_data._M_elems._24_4_;
          *(undefined4 *)
           ((__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems +
           0x1c) = block_hash.super_base_blob<256U>.m_data._M_elems._28_4_;
          *(undefined4 *)(puVar26->super_base_blob<256U>).m_data._M_elems =
               block_hash.super_base_blob<256U>.m_data._M_elems._0_4_;
          *(undefined4 *)
           ((__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems + 4)
               = block_hash.super_base_blob<256U>.m_data._M_elems._4_4_;
          *(undefined4 *)
           ((__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems + 8)
               = block_hash.super_base_blob<256U>.m_data._M_elems._8_4_;
          *(undefined4 *)
           ((__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems + 0xc
           ) = block_hash.super_base_blob<256U>.m_data._M_elems._12_4_;
          pcVar25 = (char *)((ulong)(uint)block_height | 0x100000000);
          (args_00->last_scanned_height).super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int> = (_Optional_payload_base<int>)pcVar25;
          iVar12 = 0;
          if (save_progress && lVar1 <= (long)tVar20.__d.__r) {
            (*pCVar31->m_chain->_vptr_Chain[6])((SyncTxState *)&loc,pCVar31->m_chain,&block_hash);
            pCVar28 = pCVar31;
            if (loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_start !=
                loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              WalletLogPrintf<int>(pCVar31,"Saving scan progress %d.\n",block_height);
              pWVar24 = GetDatabase(pCVar31);
              (*pWVar24->_vptr_WalletDatabase[0xe])(&local_1d8,pWVar24,1);
              local_1d8.m_database = pWVar24;
              WalletBatch::WriteBestBlock(&local_1d8,&loc);
              if (local_1d8.m_batch._M_t.
                  super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                  .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
                  (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                   )0x0) {
                (*(*(_func_int ***)
                    local_1d8.m_batch._M_t.
                    super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                    .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
              }
            }
            std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
                      ((_Vector_base<uint256,_std::allocator<uint256>_> *)&loc);
            pCVar31 = pCVar28;
          }
        }
        else {
          *(undefined8 *)
           ((__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems + 0x10
           ) = block_hash.super_base_blob<256U>.m_data._M_elems._16_8_;
          *(undefined8 *)
           ((__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems + 0x18
           ) = block_hash.super_base_blob<256U>.m_data._M_elems._24_8_;
          *(undefined8 *)
           (__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems =
               block_hash.super_base_blob<256U>.m_data._M_elems._0_8_;
          *(undefined8 *)
           ((__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems + 8) =
               block_hash.super_base_blob<256U>.m_data._M_elems._8_8_;
          args_00->status = FAILURE;
          iVar12 = 3;
        }
        std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock43.super_unique_lock);
        this = pCVar31;
        if (bVar30 != false) goto LAB_009a5bf6;
      }
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::~vector(&local_168);
      pCVar31 = this;
      if (iVar12 != 0) break;
    }
    bVar30 = ((ulong)max_height.super__Optional_base<int,_true,_true>._M_payload.
                     super__Optional_payload_base<int> & 0x100000000) == 0;
    pcVar25._0_1_ = bVar30;
    if ((max_height.super__Optional_base<int,_true,_true>._M_payload.
         super__Optional_payload_base<int>._M_payload <= block_height && !bVar30) ||
       (next_block != true)) break;
    block_hash.super_base_blob<256U>.m_data._M_elems[0x10] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0x10];
    block_hash.super_base_blob<256U>.m_data._M_elems[0x11] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0x11];
    block_hash.super_base_blob<256U>.m_data._M_elems[0x12] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0x12];
    block_hash.super_base_blob<256U>.m_data._M_elems[0x13] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0x13];
    block_hash.super_base_blob<256U>.m_data._M_elems[0x14] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0x14];
    block_hash.super_base_blob<256U>.m_data._M_elems[0x15] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0x15];
    block_hash.super_base_blob<256U>.m_data._M_elems[0x16] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0x16];
    block_hash.super_base_blob<256U>.m_data._M_elems[0x17] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0x17];
    block_hash.super_base_blob<256U>.m_data._M_elems[0x18] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0x18];
    block_hash.super_base_blob<256U>.m_data._M_elems[0x19] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0x19];
    block_hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1a];
    block_hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1b];
    block_hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1c];
    block_hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1d];
    block_hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1e];
    block_hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1f];
    block_hash.super_base_blob<256U>.m_data._M_elems[0] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0];
    block_hash.super_base_blob<256U>.m_data._M_elems[1] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[1];
    block_hash.super_base_blob<256U>.m_data._M_elems[2] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[2];
    block_hash.super_base_blob<256U>.m_data._M_elems[3] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[3];
    block_hash.super_base_blob<256U>.m_data._M_elems[4] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[4];
    block_hash.super_base_blob<256U>.m_data._M_elems[5] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[5];
    block_hash.super_base_blob<256U>.m_data._M_elems[6] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[6];
    block_hash.super_base_blob<256U>.m_data._M_elems[7] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[7];
    block_hash.super_base_blob<256U>.m_data._M_elems[8] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[8];
    block_hash.super_base_blob<256U>.m_data._M_elems[9] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[9];
    block_hash.super_base_blob<256U>.m_data._M_elems[10] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[10];
    block_hash.super_base_blob<256U>.m_data._M_elems[0xb] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0xb];
    block_hash.super_base_blob<256U>.m_data._M_elems[0xc] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0xc];
    block_hash.super_base_blob<256U>.m_data._M_elems[0xd] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0xd];
    block_hash.super_base_blob<256U>.m_data._M_elems[0xe] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0xe];
    block_hash.super_base_blob<256U>.m_data._M_elems[0xf] =
         next_block_hash.super_base_blob<256U>.m_data._M_elems[0xf];
    block_height = block_height + 1;
    pCVar17 = chain(this);
    (*pCVar17->_vptr_Chain[0x10])(pCVar17,&block_hash);
    parameters_1 = (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
    criticalblock42.super_unique_lock._M_device =
         (mutex_type *)tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_;
    criticalblock42.super_unique_lock._M_owns =
         (bool)tip_hash.super_base_blob<256U>.m_data._M_elems[8];
    criticalblock42.super_unique_lock._9_1_ = tip_hash.super_base_blob<256U>.m_data._M_elems[9];
    criticalblock42.super_unique_lock._10_1_ = tip_hash.super_base_blob<256U>.m_data._M_elems[10];
    criticalblock42.super_unique_lock._11_1_ = tip_hash.super_base_blob<256U>.m_data._M_elems[0xb];
    criticalblock42.super_unique_lock._12_1_ = tip_hash.super_base_blob<256U>.m_data._M_elems[0xc];
    criticalblock42.super_unique_lock._13_1_ = tip_hash.super_base_blob<256U>.m_data._M_elems[0xd];
    criticalblock42.super_unique_lock._14_1_ = tip_hash.super_base_blob<256U>.m_data._M_elems[0xe];
    criticalblock42.super_unique_lock._15_1_ = tip_hash.super_base_blob<256U>.m_data._M_elems[0xf];
    pcVar25 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp";
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock43,mutexIn,"cs_wallet",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
               ,0x7cb,false);
    GetLastBlockHash((uint256 *)&loc,this);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock43.super_unique_lock);
    tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
         loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
         super__Vector_impl_data._M_start;
    tip_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
         loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
         super__Vector_impl_data._M_finish;
    tip_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
         loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    tip_hash.super_base_blob<256U>.m_data._M_elems[0x18] = local_130;
    tip_hash.super_base_blob<256U>.m_data._M_elems[0x19] = uStack_12f;
    tip_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = uStack_12e;
    tip_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = uStack_12d;
    tip_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = uStack_12c;
    tip_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = uStack_12b;
    tip_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = uStack_12a;
    tip_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = uStack_129;
    puVar10 = (pointer)_local_130;
    if ((((ulong)max_height.super__Optional_base<int,_true,_true>._M_payload.
                 super__Optional_payload_base<int> & 0x100000000) == 0) &&
       (bVar30 = ::operator!=((base_blob<256U> *)&criticalblock42,&tip_hash.super_base_blob<256U>),
       puVar10 = (pointer)tip_hash.super_base_blob<256U>.m_data._M_elems._24_8_, bVar30)) {
      p_Var18 = (_Optional_payload_base<int> *)chain(this);
      pcVar25 = *(char **)p_Var18;
      (**(_func_int **)((long)pcVar25 + 0x80))(p_Var18);
      local_200 = (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
      puVar10 = (pointer)tip_hash.super_base_blob<256U>.m_data._M_elems._24_8_;
    }
  }
  if (((ulong)max_height.super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int> & 0x100000000) == 0) {
    WalletLogPrintf<>(this,"Scanning current mempool transactions.\n");
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock42,mutexIn,"cs_wallet",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
               ,0x7d4,false);
    p_Var18 = (_Optional_payload_base<int> *)chain(this);
    pcVar25 = *(char **)p_Var18;
    (**(_func_int **)((long)pcVar25 + 0x1a0))(p_Var18,&this->super_Notifications);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock42.super_unique_lock);
  }
  _((bilingual_str *)&criticalblock42,(ConstevalStringLiteral)0xe1baf4);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &next_block_hash,"%s ",&bStack_198);
  GetDisplayName_abi_cxx11_((string *)&criticalblock43,this);
  tinyformat::format<std::__cxx11::string>
            ((string *)&loc,(tinyformat *)&next_block_hash,(string *)&criticalblock43,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar25);
  boost::signals2::
  signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::signals2::mutex>
  ::operator()(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&loc,100
              );
  std::__cxx11::string::~string((string *)&loc);
  std::__cxx11::string::~string((string *)&criticalblock43);
  std::__cxx11::string::~string((string *)&next_block_hash);
  bilingual_str::~bilingual_str((bilingual_str *)&criticalblock42);
  if (block_height != 0) {
    if (((this->fAbortRescan)._M_base._M_i & 1U) != 0) {
      pcVar25 = "Rescan aborted at block %d. Progress=%f\n";
LAB_009a5eb4:
      WalletLogPrintf<int,double>(this,pcVar25,block_height,parameters_1);
      args_00->status = USER_ABORT;
      goto LAB_009a5ef7;
    }
    if (block_height != 0) {
      pCVar17 = chain(this);
      iVar12 = (*pCVar17->_vptr_Chain[0x24])(pCVar17);
      if ((char)iVar12 != '\0') {
        pcVar25 = "Rescan interrupted by shutdown request at block %d. Progress=%f\n";
        goto LAB_009a5eb4;
      }
    }
  }
  tVar20 = WalletRescanReserver::now(reserver);
  WalletLogPrintf<long>
            (this,"Rescan completed in %15dms\n",
             ((long)tVar20.__d.__r - (long)tVar16.__d.__r) / 1000000);
LAB_009a5ef7:
  std::
  unique_ptr<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
  ::~unique_ptr(&fast_rescan_filter);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return args_00;
}

Assistant:

CWallet::ScanResult CWallet::ScanForWalletTransactions(const uint256& start_block, int start_height, std::optional<int> max_height, const WalletRescanReserver& reserver, bool fUpdate, const bool save_progress)
{
    constexpr auto INTERVAL_TIME{60s};
    auto current_time{reserver.now()};
    auto start_time{reserver.now()};

    assert(reserver.isReserved());

    uint256 block_hash = start_block;
    ScanResult result;

    std::unique_ptr<FastWalletRescanFilter> fast_rescan_filter;
    if (!IsLegacy() && chain().hasBlockFilterIndex(BlockFilterType::BASIC)) fast_rescan_filter = std::make_unique<FastWalletRescanFilter>(*this);

    WalletLogPrintf("Rescan started from block %s... (%s)\n", start_block.ToString(),
                    fast_rescan_filter ? "fast variant using block filters" : "slow variant inspecting all blocks");

    fAbortRescan = false;
    ShowProgress(strprintf("%s " + _("Rescanning…").translated, GetDisplayName()), 0); // show rescan progress in GUI as dialog or on splashscreen, if rescan required on startup (e.g. due to corruption)
    uint256 tip_hash = WITH_LOCK(cs_wallet, return GetLastBlockHash());
    uint256 end_hash = tip_hash;
    if (max_height) chain().findAncestorByHeight(tip_hash, *max_height, FoundBlock().hash(end_hash));
    double progress_begin = chain().guessVerificationProgress(block_hash);
    double progress_end = chain().guessVerificationProgress(end_hash);
    double progress_current = progress_begin;
    int block_height = start_height;
    while (!fAbortRescan && !chain().shutdownRequested()) {
        if (progress_end - progress_begin > 0.0) {
            m_scanning_progress = (progress_current - progress_begin) / (progress_end - progress_begin);
        } else { // avoid divide-by-zero for single block scan range (i.e. start and stop hashes are equal)
            m_scanning_progress = 0;
        }
        if (block_height % 100 == 0 && progress_end - progress_begin > 0.0) {
            ShowProgress(strprintf("%s " + _("Rescanning…").translated, GetDisplayName()), std::max(1, std::min(99, (int)(m_scanning_progress * 100))));
        }

        bool next_interval = reserver.now() >= current_time + INTERVAL_TIME;
        if (next_interval) {
            current_time = reserver.now();
            WalletLogPrintf("Still rescanning. At block %d. Progress=%f\n", block_height, progress_current);
        }

        bool fetch_block{true};
        if (fast_rescan_filter) {
            fast_rescan_filter->UpdateIfNeeded();
            auto matches_block{fast_rescan_filter->MatchesBlock(block_hash)};
            if (matches_block.has_value()) {
                if (*matches_block) {
                    LogDebug(BCLog::SCAN, "Fast rescan: inspect block %d [%s] (filter matched)\n", block_height, block_hash.ToString());
                } else {
                    result.last_scanned_block = block_hash;
                    result.last_scanned_height = block_height;
                    fetch_block = false;
                }
            } else {
                LogDebug(BCLog::SCAN, "Fast rescan: inspect block %d [%s] (WARNING: block filter not found!)\n", block_height, block_hash.ToString());
            }
        }

        // Find next block separately from reading data above, because reading
        // is slow and there might be a reorg while it is read.
        bool block_still_active = false;
        bool next_block = false;
        uint256 next_block_hash;
        chain().findBlock(block_hash, FoundBlock().inActiveChain(block_still_active).nextBlock(FoundBlock().inActiveChain(next_block).hash(next_block_hash)));

        if (fetch_block) {
            // Read block data
            CBlock block;
            chain().findBlock(block_hash, FoundBlock().data(block));

            if (!block.IsNull()) {
                LOCK(cs_wallet);
                if (!block_still_active) {
                    // Abort scan if current block is no longer active, to prevent
                    // marking transactions as coming from the wrong block.
                    result.last_failed_block = block_hash;
                    result.status = ScanResult::FAILURE;
                    break;
                }
                for (size_t posInBlock = 0; posInBlock < block.vtx.size(); ++posInBlock) {
                    SyncTransaction(block.vtx[posInBlock], TxStateConfirmed{block_hash, block_height, static_cast<int>(posInBlock)}, fUpdate, /*rescanning_old_block=*/true);
                }
                // scan succeeded, record block as most recent successfully scanned
                result.last_scanned_block = block_hash;
                result.last_scanned_height = block_height;

                if (save_progress && next_interval) {
                    CBlockLocator loc = m_chain->getActiveChainLocator(block_hash);

                    if (!loc.IsNull()) {
                        WalletLogPrintf("Saving scan progress %d.\n", block_height);
                        WalletBatch batch(GetDatabase());
                        batch.WriteBestBlock(loc);
                    }
                }
            } else {
                // could not scan block, keep scanning but record this block as the most recent failure
                result.last_failed_block = block_hash;
                result.status = ScanResult::FAILURE;
            }
        }
        if (max_height && block_height >= *max_height) {
            break;
        }
        {
            if (!next_block) {
                // break successfully when rescan has reached the tip, or
                // previous block is no longer on the chain due to a reorg
                break;
            }

            // increment block and verification progress
            block_hash = next_block_hash;
            ++block_height;
            progress_current = chain().guessVerificationProgress(block_hash);

            // handle updated tip hash
            const uint256 prev_tip_hash = tip_hash;
            tip_hash = WITH_LOCK(cs_wallet, return GetLastBlockHash());
            if (!max_height && prev_tip_hash != tip_hash) {
                // in case the tip has changed, update progress max
                progress_end = chain().guessVerificationProgress(tip_hash);
            }
        }
    }
    if (!max_height) {
        WalletLogPrintf("Scanning current mempool transactions.\n");
        WITH_LOCK(cs_wallet, chain().requestMempoolTransactions(*this));
    }
    ShowProgress(strprintf("%s " + _("Rescanning…").translated, GetDisplayName()), 100); // hide progress dialog in GUI
    if (block_height && fAbortRescan) {
        WalletLogPrintf("Rescan aborted at block %d. Progress=%f\n", block_height, progress_current);
        result.status = ScanResult::USER_ABORT;
    } else if (block_height && chain().shutdownRequested()) {
        WalletLogPrintf("Rescan interrupted by shutdown request at block %d. Progress=%f\n", block_height, progress_current);
        result.status = ScanResult::USER_ABORT;
    } else {
        WalletLogPrintf("Rescan completed in %15dms\n", Ticks<std::chrono::milliseconds>(reserver.now() - start_time));
    }
    return result;
}